

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

FileDescriptor * __thiscall
google::protobuf::DescriptorPool::NewPlaceholderFileWithMutexHeld
          (DescriptorPool *this,StringPiece name)

{
  int iVar1;
  FileDescriptor *__s;
  string *__return_storage_ptr__;
  FileDescriptorTables *this_00;
  StringPiece local_40;
  
  __s = (FileDescriptor *)
        anon_unknown_1::TableArena::AllocRawInternal
                  (&((this->tables_)._M_t.
                     super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                     .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>.
                    _M_head_impl)->arena_,0x90,'\"');
  memset(__s,0,0x90);
  local_40.ptr_ = name.ptr_;
  local_40.length_ = name.length_;
  __return_storage_ptr__ =
       (string *)
       anon_unknown_1::TableArena::AllocRawInternal
                 (&((this->tables_)._M_t.
                    super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                    .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>.
                   _M_head_impl)->arena_,0x20,'\x01');
  stringpiece_internal::StringPiece::ToString_abi_cxx11_(__return_storage_ptr__,&local_40);
  *(string **)__s = __return_storage_ptr__;
  if ((internal::init_protobuf_defaults_state & 1) == 0) {
    internal::InitProtobufDefaultsSlow();
  }
  *(undefined8 **)(__s + 8) = &internal::fixed_address_empty_string_abi_cxx11_;
  *(DescriptorPool **)(__s + 0x10) = this;
  *(undefined1 **)(__s + 0x78) = _FileOptions_default_instance_;
  if (FileDescriptorTables::GetEmptyInstance()::file_descriptor_tables == '\0') {
    iVar1 = __cxa_guard_acquire(&FileDescriptorTables::GetEmptyInstance()::file_descriptor_tables);
    if (iVar1 != 0) {
      this_00 = (FileDescriptorTables *)operator_new(0x1d8);
      FileDescriptorTables::FileDescriptorTables(this_00);
      internal::OnShutdownRun
                (internal::OnShutdownDelete<google::protobuf::FileDescriptorTables>::
                 anon_class_1_0_00000001::__invoke,this_00);
      FileDescriptorTables::GetEmptyInstance()::file_descriptor_tables = this_00;
      __cxa_guard_release(&FileDescriptorTables::GetEmptyInstance()::file_descriptor_tables);
    }
  }
  *(FileDescriptorTables **)(__s + 0x80) =
       FileDescriptorTables::GetEmptyInstance()::file_descriptor_tables;
  *(undefined1 **)(__s + 0x88) = _SourceCodeInfo_default_instance_;
  *(undefined2 *)(__s + 0x38) = 0x101;
  __s[0x3a] = (FileDescriptor)0x0;
  return __s;
}

Assistant:

FileDescriptor* DescriptorPool::NewPlaceholderFileWithMutexHeld(
    StringPiece name) const {
  if (mutex_) {
    mutex_->AssertHeld();
  }
  FileDescriptor* placeholder = tables_->Allocate<FileDescriptor>();
  memset(static_cast<void*>(placeholder), 0, sizeof(*placeholder));

  placeholder->name_ = tables_->AllocateString(name);
  placeholder->package_ = &internal::GetEmptyString();
  placeholder->pool_ = this;
  placeholder->options_ = &FileOptions::default_instance();
  placeholder->tables_ = &FileDescriptorTables::GetEmptyInstance();
  placeholder->source_code_info_ = &SourceCodeInfo::default_instance();
  placeholder->is_placeholder_ = true;
  placeholder->syntax_ = FileDescriptor::SYNTAX_UNKNOWN;
  placeholder->finished_building_ = true;
  // All other fields are zero or nullptr.

  return placeholder;
}